

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

uchar * gen_publickey_from_rsa(LIBSSH2_SESSION *session,EVP_PKEY *rsa,size_t *key_len)

{
  int iVar1;
  uchar *puVar2;
  BIGNUM *local_58;
  BIGNUM *n;
  BIGNUM *e;
  uchar *p;
  uchar *key;
  unsigned_long len;
  int n_bytes;
  int e_bytes;
  size_t *key_len_local;
  EVP_PKEY *rsa_local;
  LIBSSH2_SESSION *session_local;
  
  n = (BIGNUM *)0x0;
  local_58 = (BIGNUM *)0x0;
  _n_bytes = key_len;
  key_len_local = (size_t *)rsa;
  rsa_local = (EVP_PKEY *)session;
  EVP_PKEY_get_bn_param(rsa,"e",&n);
  EVP_PKEY_get_bn_param(key_len_local,"n",&local_58);
  if ((n == (BIGNUM *)0x0) || (local_58 == (BIGNUM *)0x0)) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    iVar1 = BN_num_bits((BIGNUM *)n);
    len._4_4_ = (iVar1 + 7) / 8 + 1;
    iVar1 = BN_num_bits(local_58);
    len._0_4_ = (iVar1 + 7) / 8 + 1;
    key = (uchar *)(long)(len._4_4_ + 0x13 + (int)len);
    e = (BIGNUM *)(**(code **)(rsa_local + 8))(key,rsa_local,(long)(iVar1 + 7) % 8 & 0xffffffff);
    if (e == (BIGNUM *)0x0) {
      session_local = (LIBSSH2_SESSION *)0x0;
    }
    else {
      p = (uchar *)e;
      _libssh2_htonu32((uchar *)e,7);
      *(undefined4 *)(e + 4) = 0x2d687373;
      *(undefined2 *)(e + 8) = 0x7372;
      e[10] = (BIGNUM)0x61;
      e = e + 0xb;
      e = (BIGNUM *)write_bn((uchar *)e,n,len._4_4_);
      puVar2 = write_bn((uchar *)e,(BIGNUM *)local_58,(int)len);
      *_n_bytes = (long)puVar2 - (long)p;
      session_local = (LIBSSH2_SESSION *)p;
    }
  }
  return (uchar *)session_local;
}

Assistant:

static unsigned char *
gen_publickey_from_rsa(LIBSSH2_SESSION *session, libssh2_rsa_ctx *rsa,
                       size_t *key_len)
{
    int            e_bytes, n_bytes;
    unsigned long  len;
    unsigned char *key;
    unsigned char *p;

#ifdef USE_OPENSSL_3
    BIGNUM * e = NULL;
    BIGNUM * n = NULL;

    EVP_PKEY_get_bn_param(rsa, OSSL_PKEY_PARAM_RSA_E, &e);
    EVP_PKEY_get_bn_param(rsa, OSSL_PKEY_PARAM_RSA_N, &n);
#else
    const BIGNUM * e;
    const BIGNUM * n;
#if defined(HAVE_OPAQUE_STRUCTS)
    e = NULL;
    n = NULL;

    RSA_get0_key(rsa, &n, &e, NULL);
#else
    e = rsa->e;
    n = rsa->n;
#endif
#endif
    if(!e || !n) {
        return NULL;
    }

    e_bytes = BN_num_bytes(e) + 1;
    n_bytes = BN_num_bytes(n) + 1;

    /* Key form is "ssh-rsa" + e + n. */
    len = 4 + 7 + 4 + e_bytes + 4 + n_bytes;

    key = LIBSSH2_ALLOC(session, len);
    if(!key) {
        return NULL;
    }

    /* Process key encoding. */
    p = key;

    _libssh2_htonu32(p, 7);  /* Key type. */
    p += 4;
    memcpy(p, "ssh-rsa", 7);
    p += 7;

    p = write_bn(p, e, e_bytes);
    p = write_bn(p, n, n_bytes);

    *key_len = (size_t)(p - key);
    return key;
}